

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
slang::SmallVectorBase<slang::SourceLocation>::emplace_back<slang::SourceLocation_const&>
          (SmallVectorBase<slang::SourceLocation> *this,SourceLocation *args)

{
  SourceLocation *pSVar1;
  size_type sVar2;
  ulong uVar3;
  SourceLocation *pSVar4;
  SourceLocation *pSVar5;
  SourceLocation *pSVar6;
  SourceLocation SVar7;
  SourceLocation ctx;
  long lVar8;
  SourceLocation *pSVar9;
  
  pSVar9 = this->data_ + this->len;
  if (this->len != this->cap) {
    *pSVar9 = *args;
    sVar2 = this->len;
    this->len = sVar2 + 1;
    return this->data_ + sVar2;
  }
  if (this->len == 0xfffffffffffffff) {
    detail::throwLengthError();
  }
  SVar7 = (SourceLocation)(this->len + 1);
  uVar3 = this->cap;
  ctx = (SourceLocation)(uVar3 * 2);
  if ((ulong)SVar7 < (ulong)ctx) {
    SVar7 = ctx;
  }
  if (0xfffffffffffffff - uVar3 < uVar3) {
    SVar7 = (SourceLocation)0xfffffffffffffff;
  }
  lVar8 = (long)pSVar9 - (long)this->data_;
  pSVar4 = (SourceLocation *)operator_new((long)SVar7 * 8);
  *(SourceLocation *)((long)pSVar4 + lVar8) = *args;
  pSVar6 = this->data_;
  pSVar1 = pSVar6 + this->len;
  pSVar5 = pSVar4;
  if (pSVar1 == pSVar9) {
    for (; pSVar6 != pSVar9; pSVar6 = pSVar6 + 1) {
      *pSVar5 = *pSVar6;
      pSVar5 = pSVar5 + 1;
    }
  }
  else {
    for (; pSVar6 != pSVar9; pSVar6 = pSVar6 + 1) {
      ctx = *pSVar6;
      *pSVar5 = ctx;
      pSVar5 = pSVar5 + 1;
    }
    pSVar6 = (SourceLocation *)(lVar8 + (long)pSVar4);
    for (; pSVar6 = pSVar6 + 1, pSVar9 != pSVar1; pSVar9 = pSVar9 + 1) {
      *pSVar6 = *pSVar9;
    }
  }
  cleanup(this,(EVP_PKEY_CTX *)ctx);
  this->len = this->len + 1;
  this->cap = (size_type)SVar7;
  this->data_ = pSVar4;
  return (reference)((long)pSVar4 + lVar8);
}

Assistant:

reference emplace_back(Args&&... args) {
        if (len == cap)
            return *emplaceRealloc(end(), std::forward<Args>(args)...);

        new (end()) T(std::forward<Args>(args)...);
        len++;
        return back();
    }